

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O2

void LidlNormalizerTests(void)

{
  CMReturn In;
  ConfusableMatcher *pCVar1;
  _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
  *p_Var2;
  pair<int,_int> eq;
  CMReturn res;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  chr;
  vector<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
  data;
  tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
  entry;
  undefined8 local_170;
  ConfusableMatcher *local_168;
  _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
  *local_160;
  CMReturn local_158;
  undefined1 local_140 [32];
  _Alloc_hider local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 local_100;
  undefined7 uStack_ff;
  undefined1 uStack_f8;
  undefined7 uStack_f7;
  undefined1 uStack_f0;
  undefined7 uStack_ef;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  vector<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
  local_d0;
  string local_b8;
  string local_98;
  _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
  local_78;
  
  local_168 = LidlNormalizerCMSetup();
  LidlNormalizerData_abi_cxx11_();
  local_160 = &(local_d0.
                super__Vector_base<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
               super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
  ;
  for (p_Var2 = &(local_d0.
                  super__Vector_base<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
      ; pCVar1 = local_168, p_Var2 != local_160; p_Var2 = p_Var2 + 1) {
    std::
    _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
    ::_Tuple_impl(&local_78,p_Var2);
    local_140._0_8_ = local_140 + 0x10;
    local_140._8_8_ = 0;
    local_140[0x10] = '\0';
    local_120._M_p = (pointer)&local_110;
    local_118 = 0;
    local_170 = 0;
    local_110._M_local_buf[0] = '\0';
    local_158.Start = (uint64_t)&local_170;
    local_158.Size = (uint64_t)local_140;
    std::_Tuple_impl<0ul,std::pair<std::__cxx11::string,std::__cxx11::string>&,std::pair<int,int>&>
    ::_M_assign<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<int,int>>
              ((_Tuple_impl<0ul,std::pair<std::__cxx11::string,std::__cxx11::string>&,std::pair<int,int>&>
                *)&local_158,&local_78);
    std::__cxx11::string::string((string *)&local_98,(string *)local_140);
    std::__cxx11::string::string((string *)&local_b8,(string *)&local_120);
    local_100 = 1;
    uStack_ff = 0;
    uStack_f8 = 0;
    uStack_f7 = 0;
    uStack_f0 = 0;
    uStack_ef = 0;
    uStack_e8 = 1000000000;
    local_e0 = 0;
    uStack_d8 = 0;
    ConfusableMatcher::IndexOf
              (&local_158,local_168,&local_98,&local_b8,
               (CMOptions)ZEXT3248(CONCAT824(1000000000,CONCAT816(0,ZEXT816(1)))));
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    In.Size = local_158.Size;
    In.Start = local_158.Start;
    In.Status = local_158.Status;
    In._20_4_ = local_158._20_4_;
    AssertMatch(In,(long)(int)local_170,(long)local_170._4_4_);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_140);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_78.
             super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
             ._M_head_impl);
  }
  ConfusableMatcher::~ConfusableMatcher(local_168);
  operator_delete(pCVar1,0x2000);
  std::
  vector<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
  ::~vector(&local_d0);
  return;
}

Assistant:

void LidlNormalizerTests()
{
	auto matcher = LidlNormalizerCMSetup();
	auto data = LidlNormalizerData();
	auto opts = LidlNormalizerOpts();

	for (auto entry : data) {
		std::pair<std::string, std::string> chr;
		std::pair<int, int> eq;
		std::tie(chr, eq) = entry;
		auto res = matcher->IndexOf(chr.first, chr.second, opts);
		AssertMatch(res, eq.first, eq.second);
	}

	delete matcher;
}